

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t encoder_set_option(aom_codec_alg_priv_t_conflict *ctx,char *name,char *value)

{
  uint *puVar1;
  int iVar2;
  av1_extracfg *extra_cfg_00;
  size_t sVar3;
  char *__s;
  char *__s_00;
  char *in_RDX;
  char *in_RSI;
  aom_codec_alg_priv_t_conflict *in_RDI;
  int operating_point_idx;
  int level;
  int val;
  int match;
  aom_codec_err_t err;
  arg arg;
  char *err_string;
  size_t len;
  char *argv [2];
  av1_extracfg extra_cfg;
  undefined4 in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int iVar4;
  aom_codec_err_t n;
  int *in_stack_fffffffffffffd40;
  arg *in_stack_fffffffffffffd48;
  char *err_msg;
  int in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffd9c;
  uint local_250;
  undefined1 auStack_94 [32];
  uint local_74;
  uint local_70;
  COST_UPDATE_TYPE local_6c;
  COST_UPDATE_TYPE local_68;
  COST_UPDATE_TYPE local_64;
  COST_UPDATE_TYPE local_60;
  int local_54;
  int local_50;
  LOOPFILTER_CONTROL local_4c;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  char *local_18;
  aom_codec_alg_priv_t_conflict *local_10;
  aom_codec_err_t local_4;
  
  if (((in_RDI == (aom_codec_alg_priv_t_conflict *)0x0) || (in_RSI == (char *)0x0)) ||
     (in_RDX == (char *)0x0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memcpy(&stack0xfffffffffffffd88,&in_RDI->extra_cfg,600);
    err_msg = "";
    extra_cfg_00 = (av1_extracfg *)strlen(local_18);
    sVar3 = strlen(local_20);
    puVar1 = &extra_cfg_00->enable_auto_alt_ref;
    __s = (local_10->ppi->error).detail;
    __s_00 = (char *)aom_malloc(0x1e4805);
    if (__s_00 == (char *)0x0) {
      local_4 = AOM_CODEC_MEM_ERROR;
    }
    else {
      snprintf(__s_00,(long)puVar1 + sVar3,"--%s=%s",local_18,local_20);
      n = AOM_CODEC_OK;
      iVar4 = 1;
      iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                               (arg_def *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                               (char **)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                                                ),err_msg);
      if (iVar2 == 0) {
        iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98
                                                ),
                                 (arg_def *)
                                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                 (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                   in_stack_fffffffffffffd88),err_msg);
        if (iVar2 == 0) {
          iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                   in_stack_fffffffffffffd98),
                                   (arg_def *)
                                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                   (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                     in_stack_fffffffffffffd88),err_msg);
          if (iVar2 == 0) {
            iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                     in_stack_fffffffffffffd98),
                                     (arg_def *)
                                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                     (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                       in_stack_fffffffffffffd88),err_msg);
            if (iVar2 == 0) {
              iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98),
                                       (arg_def *)
                                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                                       ,(char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                          in_stack_fffffffffffffd88),err_msg);
              if (iVar2 == 0) {
                iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                         in_stack_fffffffffffffd98),
                                         (arg_def *)
                                         CONCAT44(in_stack_fffffffffffffd94,
                                                  in_stack_fffffffffffffd90),
                                         (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                           in_stack_fffffffffffffd88),err_msg);
                if (iVar2 == 0) {
                  iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                           in_stack_fffffffffffffd98),
                                           (arg_def *)
                                           CONCAT44(in_stack_fffffffffffffd94,
                                                    in_stack_fffffffffffffd90),
                                           (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                             in_stack_fffffffffffffd88),err_msg);
                  if (iVar2 == 0) {
                    iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                             in_stack_fffffffffffffd98),
                                             (arg_def *)
                                             CONCAT44(in_stack_fffffffffffffd94,
                                                      in_stack_fffffffffffffd90),
                                             (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                               in_stack_fffffffffffffd88),err_msg);
                    if (iVar2 == 0) {
                      iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                               in_stack_fffffffffffffd98),
                                               (arg_def *)
                                               CONCAT44(in_stack_fffffffffffffd94,
                                                        in_stack_fffffffffffffd90),
                                               (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                 in_stack_fffffffffffffd88),err_msg)
                      ;
                      if (iVar2 == 0) {
                        iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                                 in_stack_fffffffffffffd98),
                                                 (arg_def *)
                                                 CONCAT44(in_stack_fffffffffffffd94,
                                                          in_stack_fffffffffffffd90),
                                                 (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                   in_stack_fffffffffffffd88),
                                                 err_msg);
                        if (iVar2 == 0) {
                          iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                                   in_stack_fffffffffffffd98),
                                                   (arg_def *)
                                                   CONCAT44(in_stack_fffffffffffffd94,
                                                            in_stack_fffffffffffffd90),
                                                   (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                     in_stack_fffffffffffffd88),
                                                   err_msg);
                          if (iVar2 == 0) {
                            iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                                     in_stack_fffffffffffffd98),
                                                     (arg_def *)
                                                     CONCAT44(in_stack_fffffffffffffd94,
                                                              in_stack_fffffffffffffd90),
                                                     (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                       in_stack_fffffffffffffd88),
                                                     err_msg);
                            if (iVar2 == 0) {
                              iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                                       in_stack_fffffffffffffd98),
                                                       (arg_def *)
                                                       CONCAT44(in_stack_fffffffffffffd94,
                                                                in_stack_fffffffffffffd90),
                                                       (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                         in_stack_fffffffffffffd88),
                                                       err_msg);
                              if (iVar2 == 0) {
                                iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c,
                                                                         in_stack_fffffffffffffd98),
                                                         (arg_def *)
                                                         CONCAT44(in_stack_fffffffffffffd94,
                                                                  in_stack_fffffffffffffd90),
                                                         (char **)CONCAT44(in_stack_fffffffffffffd8c
                                                                           ,
                                                  in_stack_fffffffffffffd88),err_msg);
                                if (iVar2 == 0) {
                                  iVar2 = arg_match_helper((arg *)CONCAT44(in_stack_fffffffffffffd9c
                                                                           ,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                  if (iVar2 == 0) {
                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                    if (iVar2 == 0) {
                                      iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                      if (iVar2 == 0) {
                                        iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                        if (iVar2 == 0) {
                                          iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                          if (iVar2 == 0) {
                                            iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                            if (iVar2 == 0) {
                                              iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                              if (iVar2 == 0) {
                                                iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                if (iVar2 == 0) {
                                                  iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar2 = arg_match_helper((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98),
                                                  (arg_def *)
                                                  CONCAT44(in_stack_fffffffffffffd94,
                                                           in_stack_fffffffffffffd90),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd8c,
                                                                    in_stack_fffffffffffffd88),
                                                  err_msg);
                                                  if (iVar2 == 0) {
                                                    iVar4 = 0;
                                                    snprintf(__s,200,"Cannot find aom option %s",
                                                             local_18);
                                                  }
                                                  else {
                                                    iVar2 = arg_parse_list_helper
                                                                      (in_stack_fffffffffffffd48,
                                                                       in_stack_fffffffffffffd40,n,
                                                                       (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  (local_10->cfg).tile_height_count = iVar2;
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = arg_parse_list_helper
                                                                      (in_stack_fffffffffffffd48,
                                                                       in_stack_fffffffffffffd40,n,
                                                                       (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  (local_10->cfg).tile_width_count = iVar2;
                                                  }
                                                  }
                                                  else {
                                                    local_28 = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_24 = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_2c = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_30 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_4c = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    n = allocate_and_set_string
                                                                  ((char *)CONCAT44(n,iVar4),
                                                                   (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28),
                                                  (char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    n = allocate_and_set_string
                                                                  ((char *)CONCAT44(n,iVar4),
                                                                   (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28),
                                                  (char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_50 = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_54 = arg_parse_int_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = arg_parse_int_helper
                                                                      ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  in_stack_fffffffffffffd2c = iVar2 / 100;
                                                  if (((int)in_stack_fffffffffffffd2c < 0) ||
                                                     (0x1f < (int)in_stack_fffffffffffffd2c)) {
                                                    snprintf(__s,200,
                                                  "Invalid operating point index: %d",
                                                  (ulong)in_stack_fffffffffffffd2c);
                                                  n = AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  else {
                                                    auStack_94[(int)in_stack_fffffffffffffd2c] =
                                                         (char)(iVar2 % 100);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_60 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_64 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_68 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_6c = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_70 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    local_74 = arg_parse_uint_helper
                                                                         ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else if (local_20 != (char *)0x0) {
                                                    n = allocate_and_set_string
                                                                  ((char *)CONCAT44(n,iVar4),
                                                                   (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28),
                                                  (char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_int_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_uint_helper
                                                              ((arg *)CONCAT44(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                                  }
                                                  }
                                                  else {
                                                    arg_parse_enum_helper
                                                              ((arg *)CONCAT44(n,iVar4),
                                                               (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30));
                                                  }
                                                }
                                                else {
                                                  n = allocate_and_set_string
                                                                ((char *)CONCAT44(n,iVar4),
                                                                 (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28),
                                                  (char *)extra_cfg_00);
                                                }
                                              }
                                              else {
                                                arg_parse_uint_helper
                                                          ((arg *)CONCAT44(in_stack_fffffffffffffd2c
                                                                           ,
                                                  in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                                              }
                                            }
                                            else {
                                              n = allocate_and_set_string
                                                            ((char *)CONCAT44(n,iVar4),
                                                             (char *)CONCAT44(
                                                  in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                                  (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28),
                                                  (char *)extra_cfg_00);
                                            }
                                          }
                                          else {
                                            arg_parse_enum_helper
                                                      ((arg *)CONCAT44(n,iVar4),
                                                       (char *)CONCAT44(in_stack_fffffffffffffd34,
                                                                        in_stack_fffffffffffffd30));
                                            n = handle_tuning(local_10,(av1_extracfg *)
                                                                       &stack0xfffffffffffffd88);
                                          }
                                        }
                                        else {
                                          arg_parse_uint_helper
                                                    ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                                     in_stack_fffffffffffffd28),
                                                     (char *)extra_cfg_00);
                                        }
                                      }
                                      else {
                                        arg_parse_uint_helper
                                                  ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                                   in_stack_fffffffffffffd28),
                                                   (char *)extra_cfg_00);
                                      }
                                    }
                                    else {
                                      arg_parse_uint_helper
                                                ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                                 in_stack_fffffffffffffd28),
                                                 (char *)extra_cfg_00);
                                    }
                                  }
                                  else {
                                    arg_parse_uint_helper
                                              ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                               in_stack_fffffffffffffd28),
                                               (char *)extra_cfg_00);
                                  }
                                }
                                else {
                                  arg_parse_uint_helper
                                            ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28),
                                             (char *)extra_cfg_00);
                                  if (local_250 != 0) {
                                    snprintf(__s,200,
                                             "Cannot set tile-rows because auto-tiles is already set."
                                            );
                                    n = AOM_CODEC_INVALID_PARAM;
                                  }
                                }
                              }
                              else {
                                arg_parse_uint_helper
                                          ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                           in_stack_fffffffffffffd28),
                                           (char *)extra_cfg_00);
                                if (local_250 != 0) {
                                  snprintf(__s,200,
                                           "Cannot set tile-cols because auto-tiles is already set."
                                          );
                                  n = AOM_CODEC_INVALID_PARAM;
                                }
                              }
                            }
                            else {
                              arg_parse_uint_helper
                                        ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28),
                                         (char *)extra_cfg_00);
                            }
                          }
                          else {
                            arg_parse_uint_helper
                                      ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                       in_stack_fffffffffffffd28),
                                       (char *)extra_cfg_00);
                          }
                        }
                        else {
                          arg_parse_uint_helper
                                    ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                     in_stack_fffffffffffffd28),(char *)extra_cfg_00
                                    );
                        }
                      }
                      else {
                        arg_parse_uint_helper
                                  ((arg *)CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),(char *)extra_cfg_00);
                      }
                    }
                    else {
                      arg_parse_uint_helper
                                ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ),(char *)extra_cfg_00);
                    }
                  }
                  else {
                    arg_parse_uint_helper
                              ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                               (char *)extra_cfg_00);
                  }
                }
                else {
                  arg_parse_uint_helper
                            ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                             (char *)extra_cfg_00);
                }
              }
              else {
                arg_parse_uint_helper
                          ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (char *)extra_cfg_00);
              }
            }
            else {
              arg_parse_uint_helper
                        ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (char *)extra_cfg_00);
            }
          }
          else {
            arg_parse_uint_helper
                      ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (char *)extra_cfg_00);
          }
        }
        else {
          arg_parse_uint_helper
                    ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (char *)extra_cfg_00);
        }
      }
      else {
        arg_parse_uint_helper
                  ((arg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (char *)extra_cfg_00);
      }
      aom_free(extra_cfg_00);
      if (n == AOM_CODEC_OK) {
        sVar3 = strlen(__s);
        if (sVar3 == 0) {
          (local_10->base).err_detail = (char *)0x0;
          if (iVar4 == 0) {
            local_4 = AOM_CODEC_INVALID_PARAM;
          }
          else {
            local_4 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)
                                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                                       ,extra_cfg_00);
          }
        }
        else {
          (local_10->base).err_detail = __s;
          local_4 = AOM_CODEC_INVALID_PARAM;
        }
      }
      else {
        (local_10->base).err_detail = __s;
        local_4 = n;
      }
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t encoder_set_option(aom_codec_alg_priv_t *ctx,
                                          const char *name, const char *value) {
  if (ctx == NULL || name == NULL || value == NULL)
    return AOM_CODEC_INVALID_PARAM;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  // Used to mock the argv with just one string "--{name}={value}"
  char *argv[2] = { NULL, "" };
  size_t len = strlen(name) + strlen(value) + 4;
  char *const err_string = ctx->ppi->error.detail;

#if __STDC_VERSION__ >= 201112L
  // We use the keyword _Static_assert because clang-cl does not allow the
  // convenience macro static_assert to be used in function scope. See
  // https://bugs.llvm.org/show_bug.cgi?id=48904.
  _Static_assert(sizeof(ctx->ppi->error.detail) >= ARG_ERR_MSG_MAX_LEN,
                 "The size of the err_msg buffer for arg_match_helper must be "
                 "at least ARG_ERR_MSG_MAX_LEN");
#else
  assert(sizeof(ctx->ppi->error.detail) >= ARG_ERR_MSG_MAX_LEN);
#endif

  argv[0] = aom_malloc(len * sizeof(argv[1][0]));
  if (!argv[0]) return AOM_CODEC_MEM_ERROR;
  snprintf(argv[0], len, "--%s=%s", name, value);
  struct arg arg;
  aom_codec_err_t err = AOM_CODEC_OK;

  int match = 1;
  if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_keyframe_filtering,
                       argv, err_string)) {
    extra_cfg.enable_keyframe_filtering =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.min_gf_interval, argv,
                              err_string)) {
    extra_cfg.min_gf_interval = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_gf_interval, argv,
                              err_string)) {
    extra_cfg.max_gf_interval = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_min_pyr_height,
                              argv, err_string)) {
    extra_cfg.gf_min_pyr_height = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_max_pyr_height,
                              argv, err_string)) {
    extra_cfg.gf_max_pyr_height = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cpu_used_av1, argv,
                              err_string)) {
    extra_cfg.cpu_used = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_altref, argv,
                              err_string)) {
    extra_cfg.enable_auto_alt_ref = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.noise_sens, argv,
                              err_string)) {
    extra_cfg.noise_sensitivity = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sharpness, argv,
                              err_string)) {
    extra_cfg.sharpness = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.static_thresh, argv,
                              err_string)) {
    extra_cfg.static_thresh = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.rowmtarg, argv,
                              err_string)) {
    extra_cfg.row_mt = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.fpmtarg, argv,
                              err_string)) {
    extra_cfg.fp_mt = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_cols, argv,
                              err_string)) {
    extra_cfg.tile_columns = arg_parse_uint_helper(&arg, err_string);
    if (extra_cfg.auto_tiles) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Cannot set tile-cols because auto-tiles is already set.");
      err = AOM_CODEC_INVALID_PARAM;
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_rows, argv,
                              err_string)) {
    extra_cfg.tile_rows = arg_parse_uint_helper(&arg, err_string);
    if (extra_cfg.auto_tiles) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Cannot set tile-rows because auto-tiles is already set.");
      err = AOM_CODEC_INVALID_PARAM;
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_tiles, argv,
                              err_string)) {
    extra_cfg.auto_tiles = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_tpl_model,
                              argv, err_string)) {
    extra_cfg.enable_tpl_model = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.arnr_maxframes, argv,
                              err_string)) {
    extra_cfg.arnr_max_frames = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.arnr_strength, argv,
                              err_string)) {
    extra_cfg.arnr_strength = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tune_metric, argv,
                              err_string)) {
    extra_cfg.tuning = arg_parse_enum_helper(&arg, err_string);
    err = handle_tuning(ctx, &extra_cfg);
  }
#if CONFIG_TUNE_VMAF
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.vmaf_model_path, argv,
                            err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.vmaf_model_path,
                                  &extra_cfg.vmaf_model_path, err_string);
  }
#endif
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.partition_info_path,
                            argv, err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.partition_info_path,
                                  &extra_cfg.partition_info_path, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_rate_guide_deltaq,
                              argv, err_string)) {
    extra_cfg.enable_rate_guide_deltaq =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.rate_distribution_info,
                              argv, err_string)) {
    err =
        allocate_and_set_string(value, default_extra_cfg.rate_distribution_info,
                                &extra_cfg.rate_distribution_info, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.dist_metric, argv,
                              err_string)) {
    extra_cfg.dist_metric = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cq_level, argv,
                              err_string)) {
    extra_cfg.cq_level = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_intra_rate_pct,
                              argv, err_string)) {
    extra_cfg.rc_max_intra_bitrate_pct =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_inter_rate_pct,
                              argv, err_string)) {
    extra_cfg.rc_max_inter_bitrate_pct =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_cbr_boost_pct,
                              argv, err_string)) {
    extra_cfg.gf_cbr_boost_pct = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.lossless, argv,
                              err_string)) {
    extra_cfg.lossless = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_cdef, argv,
                              err_string)) {
    extra_cfg.enable_cdef = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_restoration,
                              argv, err_string)) {
    extra_cfg.enable_restoration = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.force_video_mode,
                              argv, err_string)) {
    extra_cfg.force_video_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_obmc, argv,
                              err_string)) {
    extra_cfg.enable_obmc = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.disable_trellis_quant,
                              argv, err_string)) {
    extra_cfg.disable_trellis_quant = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_qm, argv,
                              err_string)) {
    extra_cfg.enable_qm = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.qm_max, argv,
                              err_string)) {
    extra_cfg.qm_max = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.qm_min, argv,
                              err_string)) {
    extra_cfg.qm_min = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.num_tg, argv,
                              err_string)) {
    extra_cfg.num_tg = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mtu_size, argv,
                              err_string)) {
    extra_cfg.mtu_size = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.timing_info, argv,
                              err_string)) {
    extra_cfg.timing_info_type = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.frame_parallel_decoding,
                              argv, err_string)) {
    extra_cfg.frame_parallel_decoding_mode =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dual_filter,
                              argv, err_string)) {
    extra_cfg.enable_dual_filter = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_chroma_deltaq,
                              argv, err_string)) {
    extra_cfg.enable_chroma_deltaq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.aq_mode, argv,
                              err_string)) {
    extra_cfg.aq_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltaq_mode, argv,
                              err_string)) {
    extra_cfg.deltaq_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltaq_strength, argv,
                              err_string)) {
    extra_cfg.deltaq_strength = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltalf_mode, argv,
                              err_string)) {
    extra_cfg.deltalf_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.frame_periodic_boost,
                              argv, err_string)) {
    extra_cfg.frame_periodic_boost = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tune_content, argv,
                              err_string)) {
    extra_cfg.content = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.input_color_primaries,
                              argv, err_string)) {
    extra_cfg.color_primaries = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.input_transfer_characteristics,
                 argv, err_string)) {
    extra_cfg.transfer_characteristics =
        arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_matrix_coefficients,
                              argv, err_string)) {
    extra_cfg.matrix_coefficients = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.input_chroma_sample_position, argv,
                 err_string)) {
    extra_cfg.chroma_sample_position = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.superblock_size, argv,
                              err_string)) {
    extra_cfg.superblock_size = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.error_resilient_mode,
                              argv, err_string)) {
    extra_cfg.error_resilient_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sframe_mode, argv,
                              err_string)) {
    extra_cfg.s_frame_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.film_grain_test, argv,
                              err_string)) {
    extra_cfg.film_grain_test_vector = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.film_grain_table,
                              argv, err_string)) {
    if (value == NULL) {
      // this parameter allows NULL as its value
      extra_cfg.film_grain_table_filename = value;
    } else {
      err = allocate_and_set_string(
          value, default_extra_cfg.film_grain_table_filename,
          &extra_cfg.film_grain_table_filename, err_string);
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cdf_update_mode, argv,
                              err_string)) {
    extra_cfg.cdf_update_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_rect_partitions,
                              argv, err_string)) {
    extra_cfg.enable_rect_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_ab_partitions,
                              argv, err_string)) {
    extra_cfg.enable_ab_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_1to4_partitions,
                              argv, err_string)) {
    extra_cfg.enable_1to4_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.min_partition_size,
                              argv, err_string)) {
    extra_cfg.min_partition_size = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_partition_size,
                              argv, err_string)) {
    extra_cfg.max_partition_size = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_intra_edge_filter,
                              argv, err_string)) {
    extra_cfg.enable_intra_edge_filter =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_order_hint,
                              argv, err_string)) {
    extra_cfg.enable_order_hint = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_tx64, argv,
                              err_string)) {
    extra_cfg.enable_tx64 = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_flip_idtx,
                              argv, err_string)) {
    extra_cfg.enable_flip_idtx = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_rect_tx, argv,
                              err_string)) {
    extra_cfg.enable_rect_tx = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dist_wtd_comp,
                              argv, err_string)) {
    extra_cfg.enable_dist_wtd_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_reference_frames,
                              argv, err_string)) {
    extra_cfg.max_reference_frames = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.reduced_reference_set,
                              argv, err_string)) {
    extra_cfg.enable_reduced_reference_set =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_ref_frame_mvs,
                              argv, err_string)) {
    extra_cfg.enable_ref_frame_mvs = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_masked_comp,
                              argv, err_string)) {
    extra_cfg.enable_masked_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_onesided_comp,
                              argv, err_string)) {
    extra_cfg.enable_onesided_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interintra_comp,
                              argv, err_string)) {
    extra_cfg.enable_interintra_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_smooth_interintra,
                              argv, err_string)) {
    extra_cfg.enable_smooth_interintra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_diff_wtd_comp,
                              argv, err_string)) {
    extra_cfg.enable_diff_wtd_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interinter_wedge,
                              argv, err_string)) {
    extra_cfg.enable_interinter_wedge = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interintra_wedge,
                              argv, err_string)) {
    extra_cfg.enable_interintra_wedge = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_global_motion,
                              argv, err_string)) {
    extra_cfg.enable_global_motion = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_warped_motion,
                              argv, err_string)) {
    extra_cfg.enable_warped_motion = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_filter_intra,
                              argv, err_string)) {
    extra_cfg.enable_filter_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_smooth_intra,
                              argv, err_string)) {
    extra_cfg.enable_smooth_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_paeth_intra,
                              argv, err_string)) {
    extra_cfg.enable_paeth_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_cfl_intra,
                              argv, err_string)) {
    extra_cfg.enable_cfl_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_directional_intra,
                              argv, err_string)) {
    extra_cfg.enable_directional_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_diagonal_intra,
                              argv, err_string)) {
    extra_cfg.enable_diagonal_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_overlay, argv,
                              err_string)) {
    extra_cfg.enable_overlay = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_palette, argv,
                              err_string)) {
    extra_cfg.enable_palette = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_intrabc, argv,
                              err_string)) {
    extra_cfg.enable_intrabc = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_angle_delta,
                              argv, err_string)) {
    extra_cfg.enable_angle_delta = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.enable_low_complexity_decode, argv,
                 err_string)) {
    extra_cfg.enable_low_complexity_decode =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.reduced_tx_type_set,
                              argv, err_string)) {
    extra_cfg.reduced_tx_type_set = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.use_intra_dct_only,
                              argv, err_string)) {
    extra_cfg.use_intra_dct_only = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.use_inter_dct_only,
                              argv, err_string)) {
    extra_cfg.use_inter_dct_only = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.use_intra_default_tx_only,
                              argv, err_string)) {
    extra_cfg.use_intra_default_tx_only =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.quant_b_adapt, argv,
                              err_string)) {
    extra_cfg.quant_b_adapt = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.vbr_corpus_complexity_lap,
                              argv, err_string)) {
    extra_cfg.vbr_corpus_complexity_lap =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.set_tier_mask, argv,
                              err_string)) {
    extra_cfg.tier_mask = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.set_min_cr, argv,
                              err_string)) {
    extra_cfg.min_cr = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.coeff_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.coeff_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mode_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.mode_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mv_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.mv_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.dv_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.dv_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  }
#if CONFIG_DENOISE
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.denoise_noise_level,
                            argv, err_string)) {
    extra_cfg.noise_level =
        (float)arg_parse_int_helper(&arg, err_string) / 10.0f;
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.denoise_block_size,
                              argv, err_string)) {
    extra_cfg.noise_block_size = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dnl_denoising,
                              argv, err_string)) {
    extra_cfg.enable_dnl_denoising = arg_parse_uint_helper(&arg, err_string);
  }
#endif
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.target_seq_level_idx,
                            argv, err_string)) {
    const int val = arg_parse_int_helper(&arg, err_string);
    const int level = val % 100;
    const int operating_point_idx = val / 100;
    if (operating_point_idx < 0 ||
        operating_point_idx >= MAX_NUM_OPERATING_POINTS) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Invalid operating point index: %d", operating_point_idx);
      err = AOM_CODEC_INVALID_PARAM;
    } else {
      extra_cfg.target_seq_level_idx[operating_point_idx] = (AV1_LEVEL)level;
    }
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_chroma_subsampling_x,
                              argv, err_string)) {
    extra_cfg.chroma_subsampling_x = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_chroma_subsampling_y,
                              argv, err_string)) {
    extra_cfg.chroma_subsampling_y = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.passes, argv,
                              err_string)) {
    extra_cfg.passes = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.fwd_kf_dist, argv,
                              err_string)) {
    extra_cfg.fwd_kf_dist = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.two_pass_output, argv,
                              err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.two_pass_output,
                                  &extra_cfg.two_pass_output, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.second_pass_log, argv,
                              err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.second_pass_log,
                                  &extra_cfg.second_pass_log, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.loopfilter_control,
                              argv, err_string)) {
    extra_cfg.loopfilter_control = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_intra_tools_off,
                              argv, err_string)) {
    extra_cfg.auto_intra_tools_off = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.strict_level_conformance,
                              argv, err_string)) {
    extra_cfg.strict_level_conformance = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sb_qp_sweep, argv,
                              err_string)) {
    extra_cfg.sb_qp_sweep = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.kf_max_pyr_height,
                              argv, err_string)) {
    extra_cfg.kf_max_pyr_height = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_width, argv,
                              err_string)) {
    ctx->cfg.tile_width_count = arg_parse_list_helper(
        &arg, ctx->cfg.tile_widths, MAX_TILE_WIDTHS, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_height, argv,
                              err_string)) {
    ctx->cfg.tile_height_count = arg_parse_list_helper(
        &arg, ctx->cfg.tile_heights, MAX_TILE_HEIGHTS, err_string);
  } else {
    match = 0;
    snprintf(err_string, ARG_ERR_MSG_MAX_LEN, "Cannot find aom option %s",
             name);
  }
  aom_free(argv[0]);

  if (err != AOM_CODEC_OK) {
    ctx->base.err_detail = err_string;
    return err;
  }

  if (strlen(err_string) != 0) {
    ctx->base.err_detail = err_string;
    return AOM_CODEC_INVALID_PARAM;
  }

  ctx->base.err_detail = NULL;

  if (!match) {
    return AOM_CODEC_INVALID_PARAM;
  }
  return update_extra_cfg(ctx, &extra_cfg);
}